

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O2

int nni_dialer_find(nni_dialer **dp,uint32_t id)

{
  nni_dialer *pnVar1;
  int iVar2;
  
  nni_mtx_lock(&dialers_lk);
  pnVar1 = (nni_dialer *)nni_id_get(&dialers,(ulong)id);
  if (pnVar1 == (nni_dialer *)0x0) {
    iVar2 = 0xc;
  }
  else {
    pnVar1->d_ref = pnVar1->d_ref + 1;
    *dp = pnVar1;
    iVar2 = 0;
  }
  nni_mtx_unlock(&dialers_lk);
  return iVar2;
}

Assistant:

int
nni_dialer_find(nni_dialer **dp, uint32_t id)
{
	nni_dialer *d;

	nni_mtx_lock(&dialers_lk);
	if ((d = nni_id_get(&dialers, id)) != NULL) {
		d->d_ref++;
		*dp = d;
	}
	nni_mtx_unlock(&dialers_lk);
	return (d == NULL ? NNG_ENOENT : 0);
}